

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.cpp
# Opt level: O1

void __thiscall
dg::vr::RelationsAnalyzer::opGen(RelationsAnalyzer *this,ValueRelations *graph,BinaryOperator *op)

{
  char cVar1;
  char cVar2;
  BinaryOperator BVar3;
  long lVar4;
  long lVar5;
  BinaryOps opcode;
  bool bVar6;
  bool bVar7;
  
  lVar4 = *(long *)(op + -0x40);
  lVar5 = *(long *)(op + -0x20);
  cVar1 = *(char *)(lVar4 + 0x10);
  cVar2 = *(char *)(lVar5 + 0x10);
  BVar3 = op[0x10];
  opcode = (byte)BVar3 - AShr;
  solveByOperands(this,graph,op,true);
  if ((((byte)BVar3 | 4) == 0x2c) && (solveByOperands(this,graph,op,false), opcode == Mul)) {
    return;
  }
  bVar6 = cVar2 == '\x10';
  bVar7 = cVar1 == '\x10';
  if ((lVar4 != 0 && bVar7) && (lVar5 != 0 && bVar6)) {
    return;
  }
  if ((lVar4 == 0 || !bVar7) && (lVar5 == 0 || !bVar6)) {
    solveNonConstants(graph,opcode,op);
    return;
  }
  solveDifferent(this,graph,op);
  return;
}

Assistant:

void RelationsAnalyzer::opGen(ValueRelations &graph,
                              const llvm::BinaryOperator *op) {
    const auto *c1 = llvm::dyn_cast<llvm::ConstantInt>(op->getOperand(0));
    const auto *c2 = llvm::dyn_cast<llvm::ConstantInt>(op->getOperand(1));
    auto opcode = op->getOpcode();

    solveEquality(graph, op);
    if (opcode == llvm::Instruction::Add || opcode == llvm::Instruction::Mul)
        solveCommutativity(graph, op);

    if (opcode == llvm::Instruction::Mul)
        return;

    if (c1 && c2)
        return;

    if (!c1 && !c2)
        return solveNonConstants(graph, opcode, op);

    solveDifferent(graph, op);
}